

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.h
# Opt level: O2

void __thiscall
chrono::ChQuaternion<double>::ArchiveOUT(ChQuaternion<double> *this,ChArchiveOut *marchive)

{
  ChNameValue<double> local_78;
  ChNameValue<double> local_60;
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChQuaternion<double>>(marchive);
  local_30._name = "e0";
  local_30._flags = '\0';
  local_30._value = this->m_data;
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = this->m_data + 1;
  local_48._name = "e1";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = this->m_data + 2;
  local_60._name = "e2";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  local_78._value = this->m_data + 3;
  local_78._name = "e3";
  local_78._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_78);
  return;
}

Assistant:

inline void ChQuaternion<Real>::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChQuaternion<double>>();  // must use specialized template (any)
    // stream out all member m_data
    marchive << CHNVP(m_data[0], "e0");
    marchive << CHNVP(m_data[1], "e1");
    marchive << CHNVP(m_data[2], "e2");
    marchive << CHNVP(m_data[3], "e3");
}